

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

void __thiscall libtorrent::aux::session_impl::update_connections_limit(session_impl *this)

{
  mutex *pmVar1;
  pointer psVar2;
  element_type *peVar3;
  torrent *this_00;
  ulong uVar4;
  size_t sVar5;
  int iVar6;
  ulong uVar7;
  shared_ptr<libtorrent::aux::torrent> *t;
  pointer psVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iter;
  int iVar12;
  int iVar13;
  int iVar14;
  pointer psVar15;
  uint uVar16;
  int local_4c;
  undefined1 local_48 [20];
  int local_34;
  
  pmVar1 = &(this->m_settings).m_mutex;
  local_48._9_7_ = SUB87(local_48._0_8_,1);
  local_48[8] = 0;
  local_48._0_8_ = pmVar1;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_48);
  local_48[8] = true;
  iVar6 = (this->m_settings).m_store.m_ints._M_elems[0x55];
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_48);
  if (iVar6 < 1) {
    iVar6 = max_open_files();
  }
  local_48[8] = 0;
  local_48._0_8_ = pmVar1;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_48);
  local_48[8] = true;
  (this->m_settings).m_store.m_ints._M_elems[0x55] = iVar6;
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_48);
  sVar5 = (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_48[8] = 0;
  local_48._0_8_ = pmVar1;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_48);
  local_48[8] = true;
  iVar6 = (this->m_settings).m_store.m_ints._M_elems[0x55];
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_48);
  if ((iVar6 < (int)sVar5) &&
     ((this->m_torrents).m_array.
      super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->m_torrents).m_array.
      super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    sVar5 = (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_48[8] = 0;
    local_48._0_8_ = pmVar1;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_48);
    local_48[8] = true;
    local_4c = (int)sVar5 - (this->m_settings).m_store.m_ints._M_elems[0x55];
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_48);
    local_48[8] = 0;
    local_48._0_8_ = pmVar1;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_48);
    local_48[8] = true;
    iVar6 = (this->m_settings).m_store.m_ints._M_elems[0x55];
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_48);
    uVar11 = (long)iVar6 /
             (long)(int)((ulong)((long)(this->m_torrents).m_array.
                                       super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->m_torrents).m_array.
                                      super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4) & 0xffffffff;
    local_48[8] = 0;
    local_48._0_8_ = pmVar1;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_48);
    local_48[8] = true;
    local_34 = (this->m_settings).m_store.m_ints._M_elems[0x55];
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_48);
    psVar15 = (this->m_torrents).m_array.
              super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar2 = (this->m_torrents).m_array.
             super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar4 = (long)local_34 % (long)(int)((ulong)((long)psVar2 - (long)psVar15) >> 4);
    iVar12 = 0;
    iVar6 = 0;
    do {
      uVar7 = uVar4 & 0xffffffff;
      iVar14 = (int)uVar4;
      iVar13 = 0;
      iVar9 = (int)uVar11;
      for (psVar8 = psVar15; psVar8 != psVar2; psVar8 = psVar8 + 1) {
        peVar3 = (psVar8->super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        iVar14 = (int)((ulong)((long)*(pointer *)
                                      ((long)&(peVar3->super_torrent_hot_members).m_connections.
                                              super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                              .
                                              super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                              ._M_impl + 8) -
                              (long)(peVar3->super_torrent_hot_members).m_connections.
                                    super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                    .
                                    super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) -
                 (int)((ulong)((long)(peVar3->m_peers_to_disconnect).
                                     super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(peVar3->m_peers_to_disconnect).
                                    super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4);
        if (iVar6 < iVar14) {
          iVar10 = iVar9 - iVar14;
          if (iVar9 - iVar14 == 0 || iVar9 < iVar14) {
            iVar10 = 0;
          }
          iVar13 = iVar13 + (uint)(iVar9 < iVar14);
          uVar7 = (ulong)(uint)((int)uVar7 + iVar10);
        }
        iVar14 = (int)uVar7;
      }
      iVar13 = iVar13 + (uint)(iVar13 == 0);
      uVar4 = (long)iVar14 % (long)iVar13;
      iVar10 = (int)uVar4;
      uVar16 = iVar14 / iVar13 + iVar9;
      if (iVar14 == 0) {
        iVar10 = 0;
        break;
      }
      iVar12 = iVar12 + 1;
      uVar11 = (ulong)uVar16;
      iVar6 = iVar9;
    } while (iVar12 != 4);
    for (; psVar15 != psVar2; psVar15 = psVar15 + 1) {
      this_00 = (psVar15->super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
      iVar6 = (int)((ulong)((long)(this_00->super_torrent_hot_members).m_connections.
                                  super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                  .
                                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this_00->super_torrent_hot_members).m_connections.
                                 super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                 .
                                 super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) -
              (int)((ulong)((long)(this_00->m_peers_to_disconnect).
                                  super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this_00->m_peers_to_disconnect).
                                 super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
      if ((int)uVar16 < iVar6) {
        local_48._0_16_ = (undefined1  [16])errors::make_error_code(too_many_connections);
        iVar6 = (iVar6 - (uint)(0 < iVar10)) - uVar16;
        if (local_4c <= iVar6) {
          iVar6 = local_4c;
        }
        local_4c = local_4c - iVar6;
        iVar10 = iVar10 - (uint)(0 < iVar10);
        torrent::disconnect_peers(this_00,iVar6,(error_code *)local_48);
      }
    }
  }
  return;
}

Assistant:

void session_impl::update_connections_limit()
	{
		int limit = m_settings.get_int(settings_pack::connections_limit);

		if (limit <= 0) limit = max_open_files();

		m_settings.set_int(settings_pack::connections_limit, limit);

		if (num_connections() > m_settings.get_int(settings_pack::connections_limit)
			&& !m_torrents.empty())
		{
			// if we have more connections that we're allowed, disconnect
			// peers from the torrents so that they are all as even as possible

			int to_disconnect = num_connections() - m_settings.get_int(settings_pack::connections_limit);

			int last_average = 0;
			int average = m_settings.get_int(settings_pack::connections_limit) / int(m_torrents.size());

			// the number of slots that are unused by torrents
			int extra = m_settings.get_int(settings_pack::connections_limit) % int(m_torrents.size());

			// run 3 iterations of this, then we're probably close enough
			for (int iter = 0; iter < 4; ++iter)
			{
				// the number of torrents that are above average
				int num_above = 0;
				for (auto const& t : m_torrents)
				{
					int const num = t->num_peers();
					if (num <= last_average) continue;
					if (num > average) ++num_above;
					if (num < average) extra += average - num;
				}

				// distribute extra among the torrents that are above average
				if (num_above == 0) num_above = 1;
				last_average = average;
				average += extra / num_above;
				if (extra == 0) break;
				// save the remainder for the next iteration
				extra = extra % num_above;
			}

			for (auto const& t : m_torrents)
			{
				int const num = t->num_peers();
				if (num <= average) continue;

				// distribute the remainder
				int my_average = average;
				if (extra > 0)
				{
					++my_average;
					--extra;
				}

				int const disconnect = std::min(to_disconnect, num - my_average);
				to_disconnect -= disconnect;
				t->disconnect_peers(disconnect, errors::too_many_connections);
			}
		}
	}